

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetScrollHereY(float center_y_ratio)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  uint uVar5;
  float fVar6;
  
  pIVar4 = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).ItemSpacing.y;
  fVar2 = (pIVar4->WindowPadding).y;
  fVar3 = (pIVar4->DC).CursorPosPrevLine.y;
  uVar5 = -(uint)(fVar1 <= fVar2);
  fVar1 = (float)(~uVar5 & (uint)fVar1 | uVar5 & (uint)fVar2);
  fVar6 = fVar3 - fVar1;
  (pIVar4->ScrollTarget).y =
       (float)(int)(((((((fVar3 + (pIVar4->DC).PrevLineSize.y + fVar1) - fVar6) * center_y_ratio +
                       fVar6) - (pIVar4->Pos).y) - pIVar4->DecoOuterSizeY1) -
                    pIVar4->DecoInnerSizeY1) + (pIVar4->Scroll).y);
  (pIVar4->ScrollTargetCenterRatio).y = center_y_ratio;
  (pIVar4->ScrollTargetEdgeSnapDist).y =
       (float)(~-(uint)(fVar2 - fVar1 <= 0.0) & (uint)(fVar2 - fVar1));
  return;
}

Assistant:

void ImGui::SetScrollHereY(float center_y_ratio)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    float spacing_y = ImMax(window->WindowPadding.y, g.Style.ItemSpacing.y);
    float target_pos_y = ImLerp(window->DC.CursorPosPrevLine.y - spacing_y, window->DC.CursorPosPrevLine.y + window->DC.PrevLineSize.y + spacing_y, center_y_ratio);
    SetScrollFromPosY(window, target_pos_y - window->Pos.y, center_y_ratio); // Convert from absolute to local pos

    // Tweak: snap on edges when aiming at an item very close to the edge
    window->ScrollTargetEdgeSnapDist.y = ImMax(0.0f, window->WindowPadding.y - spacing_y);
}